

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpConnection::setDataCall
          (TcpConnection *this,
          function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
          *dataFunc)

{
  ConnectionStates CVar1;
  runtime_error *this_00;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_RSI;
  long in_RDI;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_stack_ffffffffffffffe8;
  
  CVar1 = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::load
                    ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)(in_RDI + 0x238),
                     seq_cst);
  if (CVar1 == PRESTART) {
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=(in_RSI,in_stack_ffffffffffffffe8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"cannot set data callback after socket is started");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpConnection::setDataCall(
    std::function<size_t(TcpConnection::pointer, const char*, size_t)> dataFunc)
{
    if (state.load() == ConnectionStates::PRESTART) {
        dataCall = std::move(dataFunc);
    } else {
        throw(std::runtime_error(
            "cannot set data callback after socket is started"));
    }
}